

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

void ProcessEDSectors(void)

{
  undefined1 auVar1 [16];
  hash_t hVar2;
  ulong uVar3;
  void *__s;
  int *sectorrecord;
  int i;
  
  InitED();
  hVar2 = TMap<int,_EDSector,_THashTraits<int>,_TValueTraits<EDSector>_>::CountUsed(&EDSectors);
  if (hVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)numsectors;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __s = operator_new__(uVar3);
    memset(__s,0xff,(long)numsectors << 2);
    for (sectorrecord._4_4_ = 0; sectorrecord._4_4_ < numlines;
        sectorrecord._4_4_ = sectorrecord._4_4_ + 1) {
      if ((lines[sectorrecord._4_4_].special == 0xbe) && (lines[sectorrecord._4_4_].args[1] == 0xfd)
         ) {
        *(int *)((long)__s +
                (((long)lines[sectorrecord._4_4_].frontsector - (long)sectors) / 0x268) * 4) =
             lines[sectorrecord._4_4_].args[0];
        lines[sectorrecord._4_4_].special = 0;
      }
    }
    for (sectorrecord._4_4_ = 0; sectorrecord._4_4_ < numsectors;
        sectorrecord._4_4_ = sectorrecord._4_4_ + 1) {
      if (-1 < *(int *)((long)__s + (long)sectorrecord._4_4_ * 4)) {
        ProcessEDSector(sectors + sectorrecord._4_4_,
                        *(int *)((long)__s + (long)sectorrecord._4_4_ * 4));
      }
    }
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
  }
  return;
}

Assistant:

void ProcessEDSectors()
{
	int i;

	InitED();
	if (EDSectors.CountUsed() == 0) return;	// don't waste time if there's no records.

	// collect all Extradata sector records up front so we do not need to search the complete line array for each sector separately.
	int *sectorrecord = new int[numsectors];
	memset(sectorrecord, -1, numsectors * sizeof(int));
	for (i = 0; i < numlines; i++)
	{
		if (lines[i].special == Static_Init && lines[i].args[1] == Init_EDSector)
		{
			sectorrecord[lines[i].frontsector - sectors] = lines[i].args[0];
			lines[i].special = 0;
		}
	}
	for (i = 0; i < numsectors; i++)
	{
		if (sectorrecord[i] >= 0)
		{
			ProcessEDSector(&sectors[i], sectorrecord[i]);
		}
	}
	delete[] sectorrecord;
}